

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

void dxil_spv::build_gradient
               (Impl *impl,Id *coord,uint num_coords,Id *grad_x,Id *grad_y,Id bias_id,uint32_t *ops)

{
  Id component;
  Id type_id;
  Id IVar1;
  Id IVar2;
  ImageOperandsMask IVar3;
  Builder *this;
  Operation *pOVar4;
  Operation *pOVar5;
  Operation *pOVar6;
  Operation *this_00;
  Operation *scale_y;
  Operation *scale_x;
  Operation *exp2;
  Operation *vert_sub;
  Operation *horiz_sub;
  Operation *shuf_y;
  Operation *shuf_x;
  Id coord_vec;
  Id vec_type;
  Id f32_type;
  Builder *builder;
  Id bias_id_local;
  Id *grad_y_local;
  Id *grad_x_local;
  uint num_coords_local;
  Id *coord_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  component = spv::Builder::makeFloatType(this,0x20);
  type_id = spv::Builder::makeVectorType(this,component,num_coords);
  IVar1 = spv::Builder::makeFloatType(this,0x20);
  IVar1 = Converter::Impl::build_vector(impl,IVar1,coord,num_coords);
  spv::Builder::addCapability(this,CapabilityGroupNonUniformQuad);
  pOVar4 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,type_id);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(pOVar4,IVar2);
  Operation::add_id(pOVar4,IVar1);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(pOVar4,IVar2);
  pOVar5 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,type_id);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(pOVar5,IVar2);
  Operation::add_id(pOVar5,IVar1);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  Operation::add_id(pOVar5,IVar2);
  pOVar6 = Converter::Impl::allocate(impl,OpFSub,type_id);
  this_00 = Converter::Impl::allocate(impl,OpFSub,type_id);
  Operation::add_id(pOVar6,IVar1);
  Operation::add_id(pOVar6,pOVar4->id);
  Operation::add_id(this_00,IVar1);
  Operation::add_id(this_00,pOVar5->id);
  Converter::Impl::add(impl,pOVar4,false);
  Converter::Impl::add(impl,pOVar5,false);
  Converter::Impl::add(impl,pOVar6,false);
  Converter::Impl::add(impl,this_00,false);
  *grad_x = pOVar6->id;
  *grad_y = this_00->id;
  if ((*ops & 1) != 0) {
    IVar3 = spv::operator~(ImageOperandsBiasMask);
    *ops = IVar3 & *ops;
    if (impl->glsl_std450_ext == 0) {
      IVar1 = spv::Builder::import(this,"GLSL.std.450");
      impl->glsl_std450_ext = IVar1;
    }
    pOVar4 = Converter::Impl::allocate(impl,OpExtInst,component);
    Operation::add_id(pOVar4,impl->glsl_std450_ext);
    Operation::add_literal(pOVar4,0x1d);
    Operation::add_id(pOVar4,bias_id);
    Converter::Impl::add(impl,pOVar4,false);
    pOVar5 = Converter::Impl::allocate(impl,OpVectorTimesScalar,type_id);
    pOVar6 = Converter::Impl::allocate(impl,OpVectorTimesScalar,type_id);
    Operation::add_id(pOVar5,*grad_x);
    Operation::add_id(pOVar5,pOVar4->id);
    Operation::add_id(pOVar6,*grad_y);
    Operation::add_id(pOVar6,pOVar4->id);
    Converter::Impl::add(impl,pOVar5,false);
    Converter::Impl::add(impl,pOVar6,false);
    *grad_x = pOVar5->id;
    *grad_y = pOVar6->id;
  }
  *ops = *ops | 4;
  return;
}

Assistant:

static void build_gradient(Converter::Impl &impl, const spv::Id *coord, unsigned num_coords,
                           spv::Id &grad_x, spv::Id &grad_y, spv::Id bias_id, uint32_t &ops)
{
	auto &builder = impl.builder();
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id vec_type = builder.makeVectorType(f32_type, num_coords);
	spv::Id coord_vec = impl.build_vector(builder.makeFloatType(32), coord, num_coords);
	builder.addCapability(spv::CapabilityGroupNonUniformQuad);

	auto *shuf_x = impl.allocate(spv::OpGroupNonUniformQuadSwap, vec_type);
	shuf_x->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	shuf_x->add_id(coord_vec);
	shuf_x->add_id(builder.makeUintConstant(0));

	auto *shuf_y = impl.allocate(spv::OpGroupNonUniformQuadSwap, vec_type);
	shuf_y->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	shuf_y->add_id(coord_vec);
	shuf_y->add_id(builder.makeUintConstant(1));

	// Sign does not matter here. LOD computation takes absolute values.
	auto *horiz_sub = impl.allocate(spv::OpFSub, vec_type);
	auto *vert_sub = impl.allocate(spv::OpFSub, vec_type);
	horiz_sub->add_id(coord_vec);
	horiz_sub->add_id(shuf_x->id);
	vert_sub->add_id(coord_vec);
	vert_sub->add_id(shuf_y->id);

	impl.add(shuf_x);
	impl.add(shuf_y);
	impl.add(horiz_sub);
	impl.add(vert_sub);

	grad_x = horiz_sub->id;
	grad_y = vert_sub->id;

	if (ops & spv::ImageOperandsBiasMask)
	{
		ops &= ~spv::ImageOperandsBiasMask;

		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		auto *exp2 = impl.allocate(spv::OpExtInst, f32_type);
		exp2->add_id(impl.glsl_std450_ext);
		exp2->add_literal(GLSLstd450Exp2);
		exp2->add_id(bias_id);
		impl.add(exp2);

		auto *scale_x = impl.allocate(spv::OpVectorTimesScalar, vec_type);
		auto *scale_y = impl.allocate(spv::OpVectorTimesScalar, vec_type);
		scale_x->add_id(grad_x);
		scale_x->add_id(exp2->id);
		scale_y->add_id(grad_y);
		scale_y->add_id(exp2->id);

		impl.add(scale_x);
		impl.add(scale_y);
		grad_x = scale_x->id;
		grad_y = scale_y->id;
	}

	ops |= spv::ImageOperandsGradMask;
}